

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int GetLine(void)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
LAB_00360e04:
  do {
    pcVar4 = igets();
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
    cVar1 = *pcVar4;
    if (cVar1 != '\0') {
      if (cVar1 == '#') goto LAB_00360e04;
      do {
        iVar3 = isspace((int)cVar1);
        if (iVar3 == 0) break;
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
    Line1 = pcVar4;
  } while (*pcVar4 == '\0');
  pcVar5 = strchr(pcVar4,0x3d);
  pcVar6 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    do {
      pcVar6 = pcVar4 + 1;
      pcVar5 = pcVar4 + 1;
      pcVar4 = pcVar5;
    } while (' ' < *pcVar6);
    *pcVar5 = '\0';
    iVar3 = 2;
    do {
      pcVar4 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
      if (*pcVar4 == '\0') {
        Line2 = pcVar5;
        return 2;
      }
    } while (*pcVar4 < '!');
  }
  else {
    do {
      pcVar2 = pcVar6;
      pcVar6 = pcVar2 + -1;
      if (pcVar6 < pcVar4) {
        return 0;
      }
    } while (*pcVar6 < '!');
    if (pcVar6 < pcVar4) {
      return 0;
    }
    *pcVar2 = '\0';
    do {
      cVar1 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      if (cVar1 == '\0') break;
    } while (cVar1 < '!');
    iVar3 = 1;
    if (cVar1 == '\0') {
      return 0;
    }
  }
  Line2 = pcVar5;
  return iVar3;
}

Assistant:

static int GetLine (void)
{
	char *line, *line2;

	do {
		while ( (line = igets ()) )
			if (line[0] != '#')		// Skip comment lines
				break;

		if (!line)
			return 0;

		Line1 = skipwhite (line);
	} while (Line1 && *Line1 == 0);	// Loop until we get a line with
									// more than just whitespace.
	line = strchr (Line1, '=');

	if (line) {					// We have an '=' in the input line
		line2 = line;
		while (--line2 >= Line1)
			if (*line2 > ' ')
				break;

		if (line2 < Line1)
			return 0;			// Nothing before '='

		*(line2 + 1) = 0;

		line++;
		while (*line && *line <= ' ')
			line++;

		if (*line == 0)
			return 0;			// Nothing after '='

		Line2 = line;

		return 1;
	} else {					// No '=' in input line
		line = Line1 + 1;
		while (*line > ' ')
			line++;				// Get beyond first word

		*line++ = 0;
		while (*line && *line <= ' ')
			line++;				// Skip white space

		//.bex files don't have this restriction
		//if (*line == 0)
		//	return 0;			// No second word

		Line2 = line;

		return 2;
	}
}